

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O2

void bench_ecmult_multi_teardown(void *arg,int iters)

{
  ulong uVar1;
  secp256k1_fe *in_RCX;
  long lVar2;
  long lVar3;
  secp256k1_gej tmp;
  secp256k1_gej sStack_a8;
  
  lVar3 = 0;
  uVar1 = *(ulong *)((long)arg + 0x40);
  lVar2 = 0;
  while( true ) {
    if ((int)((ulong)(long)iters / uVar1) <= lVar2) {
      return;
    }
    secp256k1_gej_add_var
              (&sStack_a8,(secp256k1_gej *)(*(long *)((long)arg + 0x60) + lVar3),
               (secp256k1_gej *)(*(long *)((long)arg + 0x30) + lVar3),in_RCX);
    if (sStack_a8.infinity == 0) break;
    lVar2 = lVar2 + 1;
    lVar3 = lVar3 + 0x80;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/bench_ecmult.c"
          ,0xe2,"test condition failed: secp256k1_gej_is_infinity(&tmp)");
  abort();
}

Assistant:

static void bench_ecmult_multi_teardown(void* arg, int iters) {
    bench_data* data = (bench_data*)arg;
    int iter;
    iters = iters / data->count;
    /* Verify the results in teardown, to avoid doing comparisons while benchmarking. */
    for (iter = 0; iter < iters; ++iter) {
        secp256k1_gej tmp;
        secp256k1_gej_add_var(&tmp, &data->output[iter], &data->expected_output[iter], NULL);
        CHECK(secp256k1_gej_is_infinity(&tmp));
    }
}